

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration * __thiscall absl::Duration::operator+=(Duration *this,Duration rhs)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  long lVar6;
  Duration DVar7;
  
  DVar7._8_8_ = rhs._8_8_;
  lVar5 = rhs.rep_hi_;
  uVar2 = this->rep_lo_;
  if ((ulong)uVar2 == 0xffffffff) {
    return this;
  }
  uVar3 = rhs.rep_lo_;
  if (uVar3 == 0xffffffff) {
    uVar4 = 0xffffffff;
  }
  else {
    lVar1 = this->rep_hi_;
    lVar6 = lVar1 + lVar5;
    this->rep_hi_ = lVar6;
    if ((long)(4000000000 - (ulong)uVar3) <= (long)(ulong)uVar2) {
      lVar6 = lVar6 + 1;
      this->rep_hi_ = lVar6;
      uVar2 = uVar2 + 0x1194d800;
    }
    this->rep_lo_ = uVar2 + uVar3;
    if (lVar5 < 0) {
      if (lVar6 <= lVar1) {
        return this;
      }
      DVar7.rep_hi_ = -1;
      DVar7 = operator-((absl *)0x7fffffffffffffff,DVar7);
      uVar4 = DVar7.rep_lo_;
      lVar5 = DVar7.rep_hi_;
    }
    else {
      if (lVar1 <= lVar6) {
        return this;
      }
      uVar4 = 0xffffffff;
      lVar5 = 0x7fffffffffffffff;
    }
  }
  this->rep_hi_ = lVar5;
  this->rep_lo_ = uVar4;
  return this;
}

Assistant:

Duration& Duration::operator+=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) return *this = rhs;
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) + EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ >= kTicksPerSecond - rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) + 1);
    rep_lo_ -= kTicksPerSecond;
  }
  rep_lo_ += rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ > orig_rep_hi : rep_hi_ < orig_rep_hi) {
    return *this = rhs.rep_hi_ < 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}